

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O0

void secp256k1_testrand256(uchar *b32)

{
  uint64_t uVar1;
  undefined1 *in_RDI;
  uint64_t val;
  int i;
  int local_c;
  undefined1 *local_8;
  
  local_8 = in_RDI;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    uVar1 = secp256k1_testrand64();
    *local_8 = (char)uVar1;
    local_8[1] = (char)(uVar1 >> 8);
    local_8[2] = (char)(uVar1 >> 0x10);
    local_8[3] = (char)(uVar1 >> 0x18);
    local_8[4] = (char)(uVar1 >> 0x20);
    local_8[5] = (char)(uVar1 >> 0x28);
    local_8[6] = (char)(uVar1 >> 0x30);
    local_8[7] = (char)(uVar1 >> 0x38);
    local_8 = local_8 + 8;
  }
  return;
}

Assistant:

static void secp256k1_testrand256(unsigned char *b32) {
    int i;
    for (i = 0; i < 4; ++i) {
        uint64_t val = secp256k1_testrand64();
        b32[0] = val;
        b32[1] = val >> 8;
        b32[2] = val >> 16;
        b32[3] = val >> 24;
        b32[4] = val >> 32;
        b32[5] = val >> 40;
        b32[6] = val >> 48;
        b32[7] = val >> 56;
        b32 += 8;
    }
}